

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseDocument(TidyDocImpl *doc)

{
  NodeType NVar1;
  TidyTagId TVar2;
  ulong uVar3;
  TidyDocImpl *node;
  Dict *pDVar4;
  Node *pNVar5;
  bool bVar6;
  Bool BVar7;
  int iVar8;
  uint uVar9;
  Node *pNVar10;
  Node *pNVar11;
  AttVal *pAVar12;
  Stack *stack;
  TidyDocImpl *node_00;
  
  bVar6 = true;
LAB_0013e0f3:
  pNVar10 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar10 != (Node *)0x0) {
    if (pNVar10->type != XmlDecl) goto LAB_0013e150;
    doc->xmlDetected = yes;
    pNVar11 = prvTidyFindXmlDecl(doc);
    if ((pNVar11 == (Node *)0x0) || ((doc->root).content == (Node *)0x0)) {
      if ((1 < pNVar10->line) || (pNVar10->column != 1)) {
        prvTidyReport(doc,&doc->root,pNVar10,0x275);
      }
      goto LAB_0013e150;
    }
    goto LAB_0013e16b;
  }
LAB_0013e2cc:
  if ((doc->config).value[1].v != 0) {
    prvTidyAccessibilityChecks(doc);
  }
  pNVar10 = prvTidyFindHTML(doc);
  if (pNVar10 == (Node *)0x0) {
    pNVar10 = prvTidyInferredTag(doc,TidyTag_HTML);
    prvTidyInsertNodeAtEnd(&doc->root,pNVar10);
    ParseHTMLWithNode(doc,pNVar10);
  }
  pNVar10 = prvTidyFindTITLE(doc);
  if (pNVar10 == (Node *)0x0) {
    pNVar10 = prvTidyFindHEAD(doc);
    if (*(int *)((doc->config).value + 6) != 1) {
      prvTidyReport(doc,pNVar10,(Node *)0x0,0x262);
    }
    pNVar11 = prvTidyInferredTag(doc,TidyTag_TITLE);
    prvTidyInsertNodeAtEnd(pNVar10,pNVar11);
  }
  else if (((pNVar10->content == (Node *)0x0) && (*(int *)((doc->config).value + 6) != 1)) &&
          (BVar7 = prvTidyIsHTML5Mode(doc), BVar7 != no)) {
    prvTidyReport(doc,pNVar10,(Node *)0x0,0x293);
  }
  AttributeChecks(doc,&doc->root);
  ReplaceObsoleteElements(doc,&doc->root);
  prvTidyDropEmptyElements(doc,&doc->root);
  stack = prvTidynewStack(doc,0x10);
  node_00 = doc;
LAB_0013e3c1:
  do {
    if (node_00 == (TidyDocImpl *)0x0) {
      prvTidyfreeStack(stack);
      if ((*(int *)((doc->config).value + 0x17) != 0) &&
         (pNVar10 = prvTidyFindBody(doc), pNVar10 != (Node *)0x0)) {
        pNVar10 = pNVar10->content;
        while (pNVar10 != (Node *)0x0) {
          BVar7 = prvTidynodeIsText(pNVar10);
          if (((BVar7 == no) || (BVar7 = prvTidyIsBlank(doc->lexer,pNVar10), BVar7 != no)) &&
             ((BVar7 = prvTidynodeIsElement(pNVar10), BVar7 == no ||
              (BVar7 = nodeCMIsOnlyInline(pNVar10), BVar7 == no)))) {
            pNVar10 = pNVar10->next;
          }
          else {
            pNVar11 = prvTidyInferredTag(doc,TidyTag_P);
            prvTidyInsertNodeBeforeElement(pNVar10,pNVar11);
            while ((pNVar10 != (Node *)0x0 &&
                   ((BVar7 = prvTidynodeIsElement(pNVar10), BVar7 == no ||
                    (BVar7 = nodeCMIsOnlyInline(pNVar10), BVar7 != no))))) {
              pNVar5 = pNVar10->next;
              prvTidyRemoveNode(pNVar10);
              prvTidyInsertNodeAtEnd(pNVar11,pNVar10);
              pNVar10 = pNVar5;
            }
            TrimSpaces(doc,pNVar11);
          }
        }
      }
      if (*(int *)((doc->config).value + 0x16) == 0) {
        return;
      }
      EncloseBlockText(doc,&doc->root);
      return;
    }
    node = (TidyDocImpl *)(node_00->root).next;
    BVar7 = prvTidynodeIsText(&node_00->root);
    if ((((BVar7 != no) && (BVar7 = prvTidynodeIsText(&node_00->root), BVar7 != no)) &&
        (pNVar10 = (node_00->root).parent, pNVar10->type != DocTypeTag)) &&
       ((BVar7 = IsPreDescendant(&node_00->root), BVar7 == no &&
        ((pNVar10->tag == (Dict *)0x0 || (pNVar10->tag->parser != prvTidyParseScript)))))) {
      pNVar11 = (node_00->root).prev;
      if (pNVar11 == (Node *)0x0) {
        BVar7 = prvTidynodeHasCM(pNVar10,0x10);
        if (BVar7 != no) {
          pNVar11 = (node_00->root).prev;
          if (pNVar11 != (Node *)0x0) goto LAB_0013e5d6;
LAB_0013e5f1:
          pNVar10 = (node_00->root).parent;
          if ((pNVar10->prev != (Node *)0x0) ||
             (BVar7 = prvTidynodeHasCM(pNVar10->parent,0x10), BVar7 != no)) goto LAB_0013e400;
        }
      }
      else if ((pNVar11->tag == (Dict *)0x0) ||
              ((TVar2 = pNVar11->tag->id, TVar2 != TidyTag_BR &&
               (((TVar2 != TidyTag_SCRIPT || (pNVar11->parent == (Node *)0x0)) ||
                ((pDVar4 = pNVar11->parent->tag, pDVar4 == (Dict *)0x0 ||
                 (pDVar4->id != TidyTag_BODY)))))))) {
LAB_0013e5d6:
        BVar7 = prvTidynodeHasCM(pNVar11,0x10);
        if ((BVar7 != no) || (BVar7 = prvTidynodeIsElement((node_00->root).prev), BVar7 == no)) {
          if ((node_00->root).prev == (Node *)0x0) goto LAB_0013e5f1;
          goto LAB_0013e400;
        }
      }
      uVar9 = (node_00->root).start;
      while ((uVar9 < (node_00->root).end &&
             (BVar7 = prvTidyIsWhite((int)doc->lexer->lexbuf[uVar9]), BVar7 != no))) {
        uVar9 = (node_00->root).start + 1;
        (node_00->root).start = uVar9;
      }
    }
LAB_0013e400:
    BVar7 = prvTidynodeIsText(&node_00->root);
    if ((((BVar7 != no) && (BVar7 = prvTidynodeIsText(&node_00->root), BVar7 != no)) &&
        (pNVar10 = (node_00->root).parent, pNVar10->type != DocTypeTag)) &&
       ((BVar7 = IsPreDescendant(&node_00->root), BVar7 == no &&
        ((pNVar10->tag == (Dict *)0x0 || (pNVar10->tag->parser != prvTidyParseScript)))))) {
      pNVar11 = (node_00->root).next;
      if (pNVar11 == (Node *)0x0) {
        BVar7 = prvTidynodeHasCM(pNVar10,0x10);
        if ((BVar7 == no) ||
           ((pNVar10 = ((node_00->root).parent)->next, pNVar10 != (Node *)0x0 &&
            (BVar7 = prvTidynodeHasCM(pNVar10,0x10), BVar7 == no)))) goto LAB_0013e643;
      }
      else if (((pNVar11->tag != (Dict *)0x0) &&
               ((TVar2 = pNVar11->tag->id, TVar2 == TidyTag_BR ||
                ((((TVar2 == TidyTag_SCRIPT && (pNVar11->parent != (Node *)0x0)) &&
                  (pDVar4 = pNVar11->parent->tag, pDVar4 != (Dict *)0x0)) &&
                 (pDVar4->id == TidyTag_BODY)))))) ||
              ((BVar7 = prvTidynodeHasCM(pNVar11,0x10), BVar7 == no &&
               (((pNVar11->type | CommentTag) == StartEndTag ||
                (((BVar7 = prvTidynodeIsText(pNVar11), BVar7 != no &&
                  (pNVar11->start < pNVar11->end)) &&
                 (BVar7 = prvTidyIsWhite((int)doc->lexer->lexbuf[pNVar11->start]), BVar7 != no))))))
              )) {
LAB_0013e643:
        uVar9 = (node_00->root).end;
        while (((node_00->root).start < uVar9 &&
               (BVar7 = prvTidyIsWhite((int)doc->lexer->lexbuf[uVar9 - 1]), BVar7 != no))) {
          uVar9 = (node_00->root).end - 1;
          (node_00->root).end = uVar9;
        }
      }
    }
    BVar7 = prvTidynodeIsText(&node_00->root);
    if ((BVar7 != no) && ((node_00->root).end <= (node_00->root).start)) {
      prvTidyRemoveNode(&node_00->root);
      prvTidyFreeNode(doc,&node_00->root);
LAB_0013e475:
      node_00 = node;
      if (node == (TidyDocImpl *)0x0) {
        node_00 = (TidyDocImpl *)prvTidypop(stack);
      }
      goto LAB_0013e3c1;
    }
    if ((node_00->root).content == (Node *)0x0) goto LAB_0013e475;
    prvTidypush(stack,(Node *)node);
    node_00 = (TidyDocImpl *)(node_00->root).content;
  } while( true );
LAB_0013e150:
  BVar7 = InsertMisc(&doc->root,pNVar10);
  if (BVar7 != no) goto LAB_0013e0f3;
  NVar1 = pNVar10->type;
  if (NVar1 == EndTag) {
LAB_0013e16b:
    prvTidyReport(doc,&doc->root,pNVar10,0x235);
    prvTidyFreeNode(doc,pNVar10);
    goto LAB_0013e0f3;
  }
  if (NVar1 == StartTag) {
    if (pNVar10->tag == (Dict *)0x0) goto LAB_0013e259;
    if ((((pNVar10->tag->id == TidyTag_HTML) &&
         (pAVar12 = prvTidyAttrGetById(pNVar10,TidyAttr_XMLNS), pAVar12 != (AttVal *)0x0)) &&
        (pAVar12->value != (ctmbstr)0x0)) &&
       (iVar8 = prvTidytmbstrcasecmp(pAVar12->value,"http://www.w3.org/1999/xhtml"), iVar8 == 0)) {
      iVar8 = *(int *)((doc->config).value + 0x21);
      doc->lexer->isvoyager = yes;
      BVar7 = (Bool)(iVar8 == 0);
      prvTidySetOptionBool(doc,TidyXhtmlOut,BVar7);
      prvTidySetOptionBool(doc,TidyXmlOut,BVar7);
      if (iVar8 == 0) {
        prvTidySetOptionBool(doc,TidyUpperCaseTags,no);
        prvTidySetOptionInt(doc,TidyUpperCaseAttrs,0);
      }
    }
    if (((pNVar10->type != StartTag) || (pNVar10->tag == (Dict *)0x0)) ||
       (pNVar10->tag->id != TidyTag_HTML)) goto LAB_0013e259;
  }
  else {
    if (NVar1 == DocTypeTag) {
      if (bVar6) {
        prvTidyInsertNodeAtEnd(&doc->root,pNVar10);
        bVar6 = false;
        goto LAB_0013e0f3;
      }
      goto LAB_0013e16b;
    }
LAB_0013e259:
    prvTidyUngetToken(doc);
    pNVar10 = prvTidyInferredTag(doc,TidyTag_HTML);
  }
  pNVar11 = prvTidyFindDocType(doc);
  if (pNVar11 == (Node *)0x0) {
    uVar3 = (doc->config).value[0xe].v;
    if (uVar3 != 1) {
      if (*(int *)((doc->config).value + 6) != 1) {
        prvTidyReport(doc,(Node *)0x0,(Node *)0x0,600);
      }
      if ((uVar3 & 0xfffffffffffffffd) == 0) goto LAB_0013e2b6;
    }
    prvTidyAdjustTags(doc);
  }
LAB_0013e2b6:
  prvTidyInsertNodeAtEnd(&doc->root,pNVar10);
  ParseHTMLWithNode(doc,pNVar10);
  goto LAB_0013e2cc;
}

Assistant:

void TY_(ParseDocument)(TidyDocImpl* doc)
{
    Node *node, *html, *doctype = NULL;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->type == XmlDecl)
        {
            doc->xmlDetected = yes;

            if (TY_(FindXmlDecl)(doc) && doc->root.content)
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
            if (node->line > 1 || node->column != 1)
            {
                TY_(Report)(doc, &doc->root, node, SPACE_PRECEDING_XMLDECL);
            }
        }

        /* deal with comments etc. */
        if (InsertMisc( &doc->root, node ))
            continue;

        if (node->type == DocTypeTag)
        {
            if (doctype == NULL)
            {
                TY_(InsertNodeAtEnd)( &doc->root, node);
                doctype = node;
            }
            else
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if (node->type == StartTag && nodeIsHTML(node))
        {
            AttVal *xmlns = TY_(AttrGetById)(node, TidyAttr_XMLNS);

            if (AttrValueIs(xmlns, XHTML_NAMESPACE))
            {
                Bool htmlOut = cfgBool( doc, TidyHtmlOut );
                doc->lexer->isvoyager = yes;                  /* Unless plain HTML */
                TY_(SetOptionBool)( doc, TidyXhtmlOut, !htmlOut ); /* is specified, output*/
                TY_(SetOptionBool)( doc, TidyXmlOut, !htmlOut );   /* will be XHTML. */

                /* adjust other config options, just as in config.c */
                if ( !htmlOut )
                {
                    TY_(SetOptionBool)( doc, TidyUpperCaseTags, no );
                    TY_(SetOptionInt)( doc, TidyUpperCaseAttrs, no );
                }
            }
        }

        if ( node->type != StartTag || !nodeIsHTML(node) )
        {
            TY_(UngetToken)( doc );
            html = TY_(InferredTag)(doc, TidyTag_HTML);
        }
        else
            html = node;

        /*\
         *  #72, avoid MISSING_DOCTYPE if show-body-only.
         *  #191, also if --doctype omit, that is TidyDoctypeOmit
         *  #342, adjust tags to html4-- if not 'auto' or 'html5'
        \*/
        if (!TY_(FindDocType)(doc))
        {
            ulong dtmode = cfg( doc, TidyDoctypeMode );
            if ((dtmode != TidyDoctypeOmit) && !showingBodyOnly(doc))
                TY_(Report)(doc, NULL, NULL, MISSING_DOCTYPE);
            if ((dtmode != TidyDoctypeAuto) && (dtmode != TidyDoctypeHtml5))
            {
                /*\
                 *  Issue #342 - if not doctype 'auto', or 'html5'
                 *  then reset mode htm4-- parsing
                \*/
                TY_(AdjustTags)(doc); /* Dynamically modify the tags table to html4-- mode */
            }
        }
        TY_(InsertNodeAtEnd)( &doc->root, html);
        ParseHTMLWithNode( doc, html );
        break;
    }

    /* do this before any more document fixes */
    if ( cfg( doc, TidyAccessibilityCheckLevel ) > 0 )
        TY_(AccessibilityChecks)( doc );

    if (!TY_(FindHTML)(doc))
    {
        /* a later check should complain if <body> is empty */
        html = TY_(InferredTag)(doc, TidyTag_HTML);
        TY_(InsertNodeAtEnd)( &doc->root, html);
        ParseHTMLWithNode( doc, html );
    }

    node = TY_(FindTITLE)(doc);
    if (!node)
    {
        Node* head = TY_(FindHEAD)(doc);
        /* #72, avoid MISSING_TITLE_ELEMENT if show-body-only (but allow InsertNodeAtEnd to avoid new warning) */
        if (!showingBodyOnly(doc))
        {
            TY_(Report)(doc, head, NULL, MISSING_TITLE_ELEMENT);
        }
        TY_(InsertNodeAtEnd)(head, TY_(InferredTag)(doc, TidyTag_TITLE));
    }
    else if (!node->content && !showingBodyOnly(doc))
    {
        /* Is #839 - warn node is blank in HTML5 */
        if (TY_(IsHTML5Mode)(doc))
        {
            TY_(Report)(doc, node, NULL, BLANK_TITLE_ELEMENT);
        }
    }

    AttributeChecks(doc, &doc->root);
    ReplaceObsoleteElements(doc, &doc->root);
    TY_(DropEmptyElements)(doc, &doc->root);
    CleanSpaces(doc, &doc->root);

    if (cfgBool(doc, TidyEncloseBodyText))
        EncloseBodyText(doc);
    if (cfgBool(doc, TidyEncloseBlockText))
        EncloseBlockText(doc, &doc->root);
}